

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffflsh(fitsfile *fptr,int clearbuf,int *status)

{
  FITSfile *Fptr;
  int iVar1;
  int ii;
  long lVar2;
  
  lVar2 = 0;
  do {
    Fptr = fptr->Fptr;
    if ((-1 < Fptr->bufrecnum[lVar2]) && (Fptr->dirty[lVar2] != 0)) {
      ffbfwt(Fptr,(int)lVar2,status);
    }
    if (clearbuf != 0) {
      fptr->Fptr->bufrecnum[lVar2] = -1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x28);
  iVar1 = 0x70;
  if (*status != 0x70) {
    ffflushx(fptr->Fptr);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffflsh(fitsfile *fptr,        /* I - FITS file pointer           */
           int clearbuf,          /* I - also clear buffer contents? */
           int *status)           /* IO - error status               */
{
/*
  flush all dirty IO buffers associated with the file to disk
*/
    int ii;

/*
   no need to move to a different HDU

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
*/
    for (ii = 0; ii < NIOBUF; ii++)
    {
	/* flush modified buffer to disk */
        if ((fptr->Fptr)->bufrecnum[ii] >= 0 &&(fptr->Fptr)->dirty[ii])
           ffbfwt(fptr->Fptr, ii, status);

        if (clearbuf)
          (fptr->Fptr)->bufrecnum[ii] = -1;  /* set contents of buffer as undefined */
    }

    if (*status != READONLY_FILE)
      ffflushx(fptr->Fptr);  /* flush system buffers to disk */

    return(*status);
}